

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::matrix4d> *value)

{
  bool bVar1;
  undefined1 local_a8 [8];
  matrix4d v;
  optional<tinyusdz::value::matrix4d> *value_local;
  AsciiParser *this_local;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::operator=(value);
    this_local._7_1_ = true;
  }
  else {
    tinyusdz::value::matrix4d::matrix4d((matrix4d *)local_a8);
    bVar1 = ReadBasicType(this,(matrix4d *)local_a8);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::operator=
                (value,(matrix4d *)local_a8);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::matrix4d> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::matrix4d v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}